

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

sat_solver * Ifn_ManStrFindSolver(Gia_Man_t *p,Vec_Int_t **pvPiVars,Vec_Int_t **pvPoVars)

{
  int *piVar1;
  int iVar2;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Int_t *pVVar3;
  bool bVar4;
  int local_3c;
  int i;
  Cnf_Dat_t *pCnf;
  Gia_Obj_t *pObj;
  sat_solver *pSat;
  Vec_Int_t **pvPoVars_local;
  Vec_Int_t **pvPiVars_local;
  Gia_Man_t *p_local;
  
  p_00 = Cnf_DeriveGiaRemapped(p);
  s = sat_solver_new();
  sat_solver_setnvars(s,p_00->nVars);
  local_3c = 0;
  while( true ) {
    if (p_00->nClauses <= local_3c) {
      iVar2 = Gia_ManPiNum(p);
      pVVar3 = Vec_IntAlloc(iVar2);
      *pvPiVars = pVVar3;
      local_3c = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p->vCis);
        bVar4 = false;
        if (local_3c < iVar2) {
          pCnf = (Cnf_Dat_t *)Gia_ManCi(p,local_3c);
          bVar4 = pCnf != (Cnf_Dat_t *)0x0;
        }
        if (!bVar4) break;
        pVVar3 = *pvPiVars;
        piVar1 = p_00->pVarNums;
        iVar2 = Gia_ObjId(p,(Gia_Obj_t *)pCnf);
        Vec_IntPush(pVVar3,piVar1[iVar2]);
        local_3c = local_3c + 1;
      }
      iVar2 = Gia_ManPoNum(p);
      pVVar3 = Vec_IntAlloc(iVar2);
      *pvPoVars = pVVar3;
      local_3c = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p->vCos);
        bVar4 = false;
        if (local_3c < iVar2) {
          pCnf = (Cnf_Dat_t *)Gia_ManCo(p,local_3c);
          bVar4 = pCnf != (Cnf_Dat_t *)0x0;
        }
        if (!bVar4) break;
        pVVar3 = *pvPoVars;
        piVar1 = p_00->pVarNums;
        iVar2 = Gia_ObjId(p,(Gia_Obj_t *)pCnf);
        Vec_IntPush(pVVar3,piVar1[iVar2]);
        local_3c = local_3c + 1;
      }
      Cnf_DataFree(p_00);
      return s;
    }
    iVar2 = sat_solver_addclause(s,p_00->pClauses[local_3c],p_00->pClauses[local_3c + 1]);
    if (iVar2 == 0) break;
    local_3c = local_3c + 1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                ,0x260,"sat_solver *Ifn_ManStrFindSolver(Gia_Man_t *, Vec_Int_t **, Vec_Int_t **)");
}

Assistant:

sat_solver * Ifn_ManStrFindSolver( Gia_Man_t * p, Vec_Int_t ** pvPiVars, Vec_Int_t ** pvPoVars )
{
    sat_solver * pSat;
    Gia_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    int i;    
    pCnf = Cnf_DeriveGiaRemapped( p );
    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnf->nVars );
    // add timeframe clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );
    // inputs/outputs
    *pvPiVars = Vec_IntAlloc( Gia_ManPiNum(p) );
    Gia_ManForEachCi( p, pObj, i )
        Vec_IntPush( *pvPiVars, pCnf->pVarNums[Gia_ObjId(p, pObj)] );
    *pvPoVars = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_IntPush( *pvPoVars, pCnf->pVarNums[Gia_ObjId(p, pObj)] );
    Cnf_DataFree( pCnf );
    return pSat;
}